

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O3

REF_STATUS
ref_metric_cons_assembly
          (REF_DBL *metric,REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,
          REF_RECON_RECONSTRUCTION reconstruction)

{
  double dVar1;
  REF_NODE pRVar2;
  REF_GLOB *pRVar3;
  uint uVar4;
  REF_DBL *scalar;
  REF_DBL *hessian;
  REF_DBL *pRVar5;
  undefined8 uVar6;
  REF_STATUS RVar7;
  long lVar8;
  REF_DBL *pRVar9;
  ulong uVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  REF_DBL RVar14;
  double dVar15;
  REF_DBL state [5];
  REF_DBL conserved [5];
  long local_b8;
  REF_DBL local_88;
  REF_DBL RStack_80;
  REF_DBL local_78;
  REF_DBL RStack_70;
  REF_DBL local_68;
  REF_DBL local_58 [5];
  
  pRVar2 = ref_grid->node;
  uVar4 = pRVar2->max;
  uVar13 = (ulong)uVar4;
  if ((int)uVar4 < 0) {
    pcVar11 = "malloc cons of REF_DBL negative";
    uVar6 = 0xc31;
LAB_001bb529:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar6,
           "ref_metric_cons_assembly",pcVar11);
    RVar7 = 1;
  }
  else {
    scalar = (REF_DBL *)malloc(uVar13 * 8);
    if (scalar == (REF_DBL *)0x0) {
      pcVar11 = "malloc cons of REF_DBL NULL";
      uVar6 = 0xc31;
    }
    else {
      if (uVar4 != 0) {
        memset(scalar,0,uVar13 * 8);
      }
      hessian = (REF_DBL *)malloc(uVar13 * 0x30);
      if (hessian != (REF_DBL *)0x0) {
        if (uVar4 != 0) {
          memset(hessian,0,(uVar13 * 6 & 0xffffffff) << 3);
        }
        local_b8 = 0;
        while( true ) {
          if (0 < (int)uVar13) {
            iVar12 = 0;
            lVar8 = 0;
            do {
              if (-1 < pRVar2->global[lVar8]) {
                local_68 = prim_dual[(long)iVar12 + 4];
                local_88 = prim_dual[iVar12];
                RStack_80 = (prim_dual + iVar12)[1];
                local_78 = prim_dual[(long)iVar12 + 2];
                RStack_70 = (prim_dual + (long)iVar12 + 2)[1];
                uVar4 = ref_phys_make_conserved(&local_88,local_58);
                if (uVar4 != 0) {
                  pcVar11 = "prim2cons";
                  uVar6 = 0xc39;
                  goto LAB_001bb5be;
                }
                scalar[lVar8] = local_58[local_b8];
                uVar13 = (ulong)(uint)pRVar2->max;
              }
              lVar8 = lVar8 + 1;
              iVar12 = iVar12 + ldim;
            } while (lVar8 < (int)uVar13);
          }
          uVar4 = ref_recon_hessian(ref_grid,scalar,hessian,reconstruction);
          if (uVar4 != 0) break;
          uVar13 = (ulong)pRVar2->max;
          if (0 < (long)uVar13) {
            pRVar3 = pRVar2->global;
            uVar10 = 0;
            pRVar5 = hessian;
            pRVar9 = metric;
            do {
              if (-1 < pRVar3[uVar10]) {
                RVar14 = g[local_b8 + uVar10 * 5];
                lVar8 = 0;
                do {
                  if (RVar14 <= -RVar14) {
                    RVar14 = -RVar14;
                  }
                  dVar1 = pRVar5[lVar8];
                  dVar15 = RVar14 * dVar1 + pRVar9[lVar8];
                  pRVar9[lVar8] = dVar15;
                  RVar14 = g[local_b8 + uVar10 * 5];
                  if (0x7fefffffffffffff < (ulong)ABS(RVar14)) {
                    pcVar11 = "g not finite";
                    uVar6 = 0xc41;
                    goto LAB_001bb529;
                  }
                  if (0x7fefffffffffffff < (ulong)ABS(dVar1)) {
                    pcVar11 = "hess not finite";
                    uVar6 = 0xc42;
                    goto LAB_001bb529;
                  }
                  if (0x7fefffffffffffff < (long)ABS(dVar15)) {
                    pcVar11 = "metric not finite";
                    uVar6 = 0xc43;
                    goto LAB_001bb529;
                  }
                  lVar8 = lVar8 + 1;
                } while (lVar8 != 6);
              }
              uVar10 = uVar10 + 1;
              pRVar9 = pRVar9 + 6;
              pRVar5 = pRVar5 + 6;
            } while (uVar10 != uVar13);
          }
          local_b8 = local_b8 + 1;
          if (local_b8 == 5) {
            free(hessian);
            free(scalar);
            return 0;
          }
        }
        pcVar11 = "hess";
        uVar6 = 0xc3c;
LAB_001bb5be:
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               uVar6,"ref_metric_cons_assembly",(ulong)uVar4,pcVar11);
        return uVar4;
      }
      pcVar11 = "malloc hess_cons of REF_DBL NULL";
      uVar6 = 0xc32;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",uVar6,
           "ref_metric_cons_assembly",pcVar11);
    RVar7 = 2;
  }
  return RVar7;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_assembly(
    REF_DBL *metric, REF_DBL *g, REF_GRID ref_grid, REF_INT ldim,
    REF_DBL *prim_dual, REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node, i;
  REF_DBL state[5], conserved[5];
  REF_DBL *cons, *hess_cons;

  ref_malloc_init(cons, ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(hess_cons, 6 * ref_node_max(ref_node), REF_DBL, 0.0);

  for (var = 0; var < 5; var++) {
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 5; i++) {
        state[i] = prim_dual[i + ldim * node];
      }
      RSS(ref_phys_make_conserved(state, conserved), "prim2cons");
      cons[node] = conserved[var];
    }
    RSS(ref_recon_hessian(ref_grid, cons, hess_cons, reconstruction), "hess");
    each_ref_node_valid_node(ref_node, node) {
      for (i = 0; i < 6; i++) {
        metric[i + 6 * node] +=
            ABS(g[var + 5 * node]) * hess_cons[i + 6 * node];
        RAS(isfinite(ABS(g[var + 5 * node])), "g not finite");
        RAS(isfinite(hess_cons[i + 6 * node]), "hess not finite");
        RAS(isfinite(metric[i + 6 * node]), "metric not finite");
      }
    }
  }

  ref_free(hess_cons);
  ref_free(cons);

  return REF_SUCCESS;
}